

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O3

_Bool pi_template_resolve_symbol
                (pi_template_generator_t *ptg_context,dino_string_ptr symbol_buffer,
                dino_string_ptr result_buffer)

{
  dino_intmap_t *pdVar1;
  void *pvVar2;
  function_string_ptr_t p_Var3;
  _Bool _Var4;
  uint uVar5;
  char *pcVar6;
  char *local_38;
  char *result_ptr;
  
  pdVar1 = ptg_context->symbol_map;
  pcVar6 = dino_string_c_ptr(symbol_buffer);
  uVar5 = intmap_get_value(pdVar1,pcVar6);
  if (uVar5 < 2) {
    if (result_buffer != (dino_string_ptr)0x0) {
      dino_string_reset(result_buffer);
    }
    local_38 = (char *)0x0;
    pvVar2 = ptg_context->context_ptr;
    p_Var3 = ptg_context->function_string_ptr;
    pcVar6 = dino_string_c_ptr(symbol_buffer);
    _Var4 = (*p_Var3)(pvVar2,pcVar6,&local_38);
    if (local_38 != (char *)0x0) {
      dino_string_append_str(result_buffer,local_38);
      free(local_38);
    }
    if (_Var4 && uVar5 == 0) {
      pdVar1 = ptg_context->symbol_map;
      pcVar6 = dino_string_c_ptr(symbol_buffer);
      intmap_put(pdVar1,pcVar6,1);
    }
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool pi_template_resolve_symbol(pi_template_generator_t *ptg_context,
                                dino_string_ptr symbol_buffer,
                                dino_string_ptr result_buffer) {

    operator_type_t operator_type = (operator_type_t) intmap_get_value(ptg_context->symbol_map,
                                                                       dino_string_c_ptr(symbol_buffer));

    bool valid = false;

    if (operator_type == operator_type_invalid || operator_type == operator_type_variable) {

        if (result_buffer) {
            dino_string_reset(result_buffer);
        }

        char *result_ptr = NULL;
        valid = (*ptg_context->function_string_ptr)(ptg_context->context_ptr,
                                                    dino_string_c_ptr(symbol_buffer),
                                                    &result_ptr);

        if (result_ptr != NULL) {
            dino_string_append_str(result_buffer, result_ptr);
            free(result_ptr);
        }

        if (valid && operator_type == operator_type_invalid) {
            intmap_put(ptg_context->symbol_map, dino_string_c_ptr(symbol_buffer), operator_type_variable);
        }

    }

    return valid;
}